

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O2

KBOOL __thiscall KDIS::UTILS::DIS_Logger_Playback::EndOfLogReached(DIS_Logger_Playback *this)

{
  size_type sVar1;
  
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    sVar1 = std::
            deque<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ::size(&(this->m_qLog).c);
    if (sVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

KBOOL DIS_Logger_Playback::EndOfLogReached() const
{
    if( m_File.eof() && m_qLog.size() == 0 )return true;
    return false;
}